

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_initDCtx_internal(ZSTD_DCtx *dctx)

{
  int iVar1;
  
  dctx->staticSize = 0;
  dctx->dictEnd = (void *)0x0;
  dctx->ddictIsCold = 0;
  dctx->dictUses = ZSTD_dont_use;
  dctx->outBuffSize = 0;
  dctx->streamStage = zdss_init;
  dctx->noForwardProgress = 0;
  dctx->oversizedDuration = 0;
  iVar1 = ZSTD_cpuSupportsBmi2();
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  dctx->inBuff = (char *)0x0;
  dctx->inBuffSize = 0;
  dctx->bmi2 = iVar1;
  dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
  ZSTD_DCtx_resetParameters(dctx);
  return;
}

Assistant:

static void ZSTD_initDCtx_internal(ZSTD_DCtx* dctx)
{
    dctx->staticSize  = 0;
    dctx->ddict       = NULL;
    dctx->ddictLocal  = NULL;
    dctx->dictEnd     = NULL;
    dctx->ddictIsCold = 0;
    dctx->dictUses = ZSTD_dont_use;
    dctx->inBuff      = NULL;
    dctx->inBuffSize  = 0;
    dctx->outBuffSize = 0;
    dctx->streamStage = zdss_init;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
    dctx->legacyContext = NULL;
    dctx->previousLegacyVersion = 0;
#endif
    dctx->noForwardProgress = 0;
    dctx->oversizedDuration = 0;
#if DYNAMIC_BMI2
    dctx->bmi2 = ZSTD_cpuSupportsBmi2();
#endif
    dctx->ddictSet = NULL;
    ZSTD_DCtx_resetParameters(dctx);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    dctx->dictContentEndForFuzzing = NULL;
#endif
}